

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
actorpp::detail::ChannelImpl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::pop
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ChannelImpl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *this)

{
  bool bVar1;
  element_type *__m;
  logic_error *this_00;
  reference pvVar2;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  ChannelImpl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *element;
  
  lock._8_8_ = this;
  __m = std::
        __shared_ptr_access<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&__m->mut);
  bVar1 = readable_with_lock(this);
  if (bVar1) {
    pvVar2 = std::
             queue<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::deque<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ::front(&this->elements);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,pvVar2);
    std::
    queue<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::deque<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::pop(&this->elements);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"called pop() on unreadable channel");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

T pop() {
    std::unique_lock<std::mutex> lock(actor_impl->mut);
    if (!readable_with_lock())
      throw std::logic_error("called pop() on unreadable channel");
    T element = std::move(elements.front());
    elements.pop();
    return element;
  }